

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasso_path_extraction.hh
# Opt level: O0

vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
* __thiscall
tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>
::red_dfs(vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
          *__return_storage_ptr__,
         lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t> *this,
         graph_t *g,node_sptr_t *n,
         function<bool_(const_tchecker::tck_liveness::zg_couvscc::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>)>
         *filter_edge,
         unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
         *cyan,unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
               *blue,
         unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
         *red)

{
  bool bVar1;
  node_sptr_t *p;
  undefined1 local_148 [40];
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_120;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_118;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_110;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_108;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_100;
  node_sptr_t next;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_f0;
  edge_sptr_t edge;
  ndfs_entry_t *entry;
  undefined1 local_b8 [47];
  byte local_89;
  undefined1 local_88 [8];
  stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
  stack;
  unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  *cyan_local;
  function<bool_(const_tchecker::tck_liveness::zg_couvscc::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>)>
  *filter_edge_local;
  node_sptr_t *n_local;
  graph_t *g_local;
  lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t> *this_local;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  *red_edges;
  
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)cyan;
  std::
  stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>>>
  ::
  stack<std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>>,void>
            ((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>>>
              *)local_88);
  local_89 = 0;
  std::
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::vector(__return_storage_ptr__);
  tchecker::graph::reachability::
  graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
  ::outgoing_edges((graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
                    *)local_b8,(node_sptr_t *)g);
  ndfs_entry_t::ndfs_entry_t
            ((ndfs_entry_t *)(local_b8 + 0x10),n,
             (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)local_b8);
  std::
  stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
  ::push((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
          *)local_88,(value_type *)(local_b8 + 0x10));
  ndfs_entry_t::~ndfs_entry_t((ndfs_entry_t *)(local_b8 + 0x10));
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~range_t((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)local_b8);
  std::
  unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::insert(red,n);
  do {
    while( true ) {
      bVar1 = std::
              stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
              ::empty((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
                       *)local_88);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = std::
                vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                ::empty(__return_storage_ptr__);
        if (!bVar1) {
          __assert_fail("red_edges.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/algorithms/path/lasso_path_extraction.hh"
                        ,0x136,
                        "std::vector<edge_sptr_t> tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::red_dfs(const GRAPH &, const node_sptr_t &, std::function<bool (const GRAPH &, edge_sptr_t)> &&, std::unordered_set<node_sptr_t> &, std::unordered_set<node_sptr_t> &, std::unordered_set<node_sptr_t> &) [GRAPH = tchecker::tck_liveness::zg_couvscc::graph_t]"
                       );
        }
        local_89 = 1;
        next._t._4_4_ = 1;
        goto LAB_0013513d;
      }
      edge._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)std::
                   stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
                   ::top((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
                          *)local_88);
      bVar1 = ndfs_entry_t::fully_explored((ndfs_entry_t *)edge._t);
      if (!bVar1) break;
      std::
      stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
      ::pop((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
             *)local_88);
      bVar1 = std::
              vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
              ::empty(__return_storage_ptr__);
      if (!bVar1) {
        std::
        vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::pop_back(__return_storage_ptr__);
      }
    }
    ndfs_entry_t::current_edge((ndfs_entry_t *)&stack0xffffffffffffff18);
    ndfs_entry_t::next((ndfs_entry_t *)edge._t);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::intrusive_shared_ptr_t
              (&local_f0,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffff18);
    bVar1 = std::
            function<bool_(const_tchecker::tck_liveness::zg_couvscc::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>)>
            ::operator()(filter_edge,g,&local_f0);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_f0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      p = tchecker::graph::reachability::
          graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
          ::edge_tgt(&g->
                      super_graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
                     ,(edge_sptr_t *)&stack0xffffffffffffff18);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t(&local_100,p);
      local_108._M_cur =
           (__node_type *)
           std::
           unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
           ::find((unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                   *)stack.c.
                     super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_100);
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
           ::end((unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                  *)stack.c.
                    super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
      bVar1 = std::__detail::operator!=(&local_108,&local_110);
      if (bVar1) {
        std::
        vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&stack0xffffffffffffff18);
        local_89 = 1;
        next._t._4_4_ = 1;
      }
      else {
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
             ::find(red,&local_100);
        local_120._M_cur =
             (__node_type *)
             std::
             unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
             ::end(red);
        bVar1 = std::__detail::operator==(&local_118,&local_120);
        if (bVar1) {
          tchecker::graph::reachability::
          graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
          ::outgoing_edges((graph_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t,_tchecker::tck_liveness::zg_couvscc::node_hash_t,_tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
                            *)local_148,(node_sptr_t *)g);
          ndfs_entry_t::ndfs_entry_t
                    ((ndfs_entry_t *)(local_148 + 0x10),&local_100,
                     (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                      *)local_148);
          std::
          stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
          ::push((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
                  *)local_88,(value_type *)(local_148 + 0x10));
          ndfs_entry_t::~ndfs_entry_t((ndfs_entry_t *)(local_148 + 0x10));
          range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::~range_t((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
                      *)local_148);
          std::
          unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::insert(red,&local_100);
          std::
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&stack0xffffffffffffff18);
        }
        next._t._4_4_ = 0;
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_100);
    }
    else {
      next._t._4_4_ = 2;
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffff18);
  } while ((next._t._4_4_ == 0) || (next._t._4_4_ == 2));
LAB_0013513d:
  if ((local_89 & 1) == 0) {
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  std::
  stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
  ::~stack((stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_couvscc::graph_t>::ndfs_entry_t>_>_>
            *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<edge_sptr_t> red_dfs(GRAPH const & g, node_sptr_t const & n,
                                   std::function<bool(GRAPH const &, edge_sptr_t)> && filter_edge,
                                   std::unordered_set<node_sptr_t> & cyan, std::unordered_set<node_sptr_t> & blue,
                                   std::unordered_set<node_sptr_t> & red)
  {
    std::stack<ndfs_entry_t> stack;
    std::vector<edge_sptr_t> red_edges;

    stack.push(ndfs_entry_t{n, g.outgoing_edges(n)});
    red.insert(n);

    while (!stack.empty()) {
      ndfs_entry_t & entry = stack.top();

      if (entry.fully_explored()) {
        stack.pop();
        if (!red_edges.empty())
          red_edges.pop_back();
      }
      else {
        edge_sptr_t edge = entry.current_edge();
        entry.next();

        if (!filter_edge(g, edge))
          continue;

        node_sptr_t next = g.edge_tgt(edge);
        if (cyan.find(next) != cyan.end()) { // cycle found
          red_edges.push_back(edge);
          return red_edges;
        }
        else if (red.find(next) == red.end()) {
          stack.push(ndfs_entry_t{next, g.outgoing_edges(next)});
          red.insert(next);
          red_edges.push_back(edge);
        }
      }
    }

    assert(red_edges.empty());
    return red_edges;
  }